

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototypeNoLock
          (DynamicMessageFactory *this,Descriptor *type)

{
  FieldDescriptor *field;
  byte bVar1;
  uint *puVar2;
  long lVar3;
  once_flag *__once;
  Reflection *pRVar4;
  bool bVar5;
  DescriptorPool *pDVar6;
  mapped_type *ppTVar7;
  MessageFactory *pMVar8;
  undefined4 extraout_var;
  uint *puVar9;
  uint *puVar10;
  LogMessage *other;
  DynamicMessage *this_00;
  Reflection *this_01;
  uint uVar11;
  DescriptorPool *pDVar12;
  long lVar13;
  ulong uVar14;
  long *plVar15;
  int iVar16;
  long *plVar17;
  Descriptor *pDVar18;
  uint uVar19;
  long lVar20;
  mapped_type pTVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  int iVar26;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *puVar27;
  ReflectionSchema schema;
  Descriptor *local_90;
  mapped_type local_88;
  FieldDescriptor *local_80;
  DynamicMessageFactory *local_78;
  undefined1 local_70 [56];
  int local_38;
  
  local_90 = type;
  if ((this->delegate_to_generated_factory_ == true) &&
     (pDVar12 = *(DescriptorPool **)(*(long *)(type + 0x10) + 0x10),
     pDVar6 = DescriptorPool::generated_pool(), pDVar12 == pDVar6)) {
    pMVar8 = MessageFactory::generated_factory();
    iVar16 = (*pMVar8->_vptr_MessageFactory[2])(pMVar8,local_90);
    return (Message *)CONCAT44(extraout_var,iVar16);
  }
  ppTVar7 = std::__detail::
            _Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->prototypes_,&local_90);
  if (*ppTVar7 == (mapped_type)0x0) {
    local_88 = (mapped_type)operator_new(0x50);
    (local_88->offsets)._M_t.
    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (uint *)0x0;
    (local_88->has_bits_indices)._M_t.
    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (uint *)0x0;
    (local_88->reflection)._M_t.
    super___uniq_ptr_impl<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::Reflection_*,_std::default_delete<const_google::protobuf::Reflection>_>
    .super__Head_base<0UL,_const_google::protobuf::Reflection_*,_false>._M_head_impl =
         (Reflection *)0x0;
    local_88->prototype = (DynamicMessage *)0x0;
    *ppTVar7 = local_88;
    local_88->type = local_90;
    pDVar12 = this->pool_;
    if (pDVar12 == (DescriptorPool *)0x0) {
      pDVar12 = *(DescriptorPool **)(*(long *)(local_90 + 0x10) + 0x10);
    }
    puVar27 = &local_88->offsets;
    local_88->pool = pDVar12;
    local_88->factory = this;
    if ((long)*(int *)(local_90 + 0x68) < 1) {
      iVar16 = 0;
    }
    else {
      lVar20 = 0;
      iVar16 = 0;
      do {
        uVar25 = 1;
        if (*(int *)(*(long *)(local_90 + 0x30) + 4 + lVar20) == 1) {
          uVar25 = (uint)((*(byte *)(*(long *)(*(long *)(local_90 + 0x30) + 0x20 + lVar20) + 1) & 2)
                         == 0);
        }
        iVar16 = iVar16 + uVar25;
        lVar20 = lVar20 + 0x28;
      } while ((long)*(int *)(local_90 + 0x68) * 0x28 != lVar20);
    }
    uVar14 = 0xffffffffffffffff;
    if (-1 < (int)((long)iVar16 + (long)*(int *)(local_90 + 4))) {
      uVar14 = ((long)iVar16 + (long)*(int *)(local_90 + 4)) * 4;
    }
    local_78 = this;
    puVar9 = (uint *)operator_new__(uVar14);
    puVar10 = (puVar27->_M_t).
              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    (puVar27->_M_t).super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = puVar9;
    if (puVar10 != (uint *)0x0) {
      operator_delete__(puVar10);
    }
    local_88->has_bits_offset = -1;
    uVar14 = (ulong)*(uint *)(local_90 + 4);
    pTVar21 = local_88;
    if ((int)*(uint *)(local_90 + 4) < 1) {
      uVar25 = 0;
    }
    else {
      lVar20 = 0;
      uVar25 = 0;
      do {
        pDVar18 = local_90 + 4;
        lVar13 = *(long *)(local_90 + 0x28) + lVar20 * 0x48;
        bVar1 = *(byte *)(lVar13 + 1);
        if ((bVar1 & 2) == 0) {
          pTVar21 = local_88;
          if (((bVar1 & 0x60) == 0x20) && (*(char *)(*(long *)(lVar13 + 0x10) + 0x3a) == '\x02')) {
            if (((bVar1 & 0x10) == 0) || (*(long *)(lVar13 + 0x28) == 0)) goto LAB_003918b1;
          }
          else if ((bVar1 & 0x60) == 0x40) goto LAB_003918b1;
        }
        else {
LAB_003918b1:
          if (*(char *)(*(long *)(lVar13 + 0x38) + 0x4f) == '\0') {
            if (pTVar21->has_bits_offset == -1) {
              pTVar21->has_bits_offset = 0x20;
              uVar22 = (long)(int)uVar14 * 4;
              if ((int)uVar14 < 0) {
                uVar22 = 0xffffffffffffffff;
              }
              puVar10 = (uint *)operator_new__(uVar22);
              if (0 < *(int *)pDVar18) {
                lVar13 = 0;
                do {
                  puVar10[lVar13] = 0xffffffff;
                  lVar13 = lVar13 + 1;
                } while (lVar13 < *(int *)pDVar18);
              }
              puVar2 = (local_88->has_bits_indices)._M_t.
                       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
              (local_88->has_bits_indices)._M_t.
              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = puVar10;
              pTVar21 = local_88;
              if (puVar2 != (uint *)0x0) {
                operator_delete__(puVar2);
                pTVar21 = local_88;
              }
            }
            (pTVar21->has_bits_indices)._M_t.
            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar20] = uVar25;
            uVar25 = uVar25 + 1;
          }
        }
        lVar20 = lVar20 + 1;
        uVar14 = (ulong)*(int *)(local_90 + 4);
      } while (lVar20 < (long)uVar14);
    }
    if ((int)uVar25 < 1) {
      uVar25 = 0x20;
    }
    else {
      iVar26 = uVar25 + 0x3e;
      if (-1 < (int)(uVar25 + 0x1f)) {
        iVar26 = uVar25 + 0x1f;
      }
      uVar11 = (iVar26 >> 5) * 4 + 0x27;
      uVar25 = (iVar26 >> 5) * 4 + 0x2e;
      if (-1 < (int)uVar11) {
        uVar25 = uVar11;
      }
      uVar25 = uVar25 & 0xfffffff8;
    }
    if (0 < iVar16) {
      pTVar21->oneof_case_offset = uVar25;
      uVar11 = uVar25 + iVar16 * 4 + 7;
      uVar25 = uVar25 + iVar16 * 4 + 0xe;
      if (-1 < (int)uVar11) {
        uVar25 = uVar11;
      }
      uVar25 = uVar25 & 0xfffffff8;
    }
    if (*(int *)(local_90 + 0x78) < 1) {
      pTVar21->extensions_offset = -1;
    }
    else {
      pTVar21->extensions_offset = uVar25;
      uVar11 = uVar25 + 0x26;
      if (-1 < (int)(uVar25 + 0x1f)) {
        uVar11 = uVar25 + 0x1f;
      }
      uVar25 = uVar11 & 0xfffffff8;
    }
    if (0 < *(int *)(local_90 + 4)) {
      lVar20 = 0;
      lVar13 = 0;
      do {
        lVar3 = *(long *)(local_90 + 0x28);
        bVar1 = *(byte *)(lVar3 + 1 + lVar20);
        lVar23 = *(long *)(lVar3 + 0x28 + lVar20);
        if ((lVar23 == 0 || (bVar1 & 0x10) == 0) ||
           ((*(int *)(lVar23 + 4) == 1 && ((*(byte *)(*(long *)(lVar23 + 0x20) + 1) & 2) != 0)))) {
          field = (FieldDescriptor *)(lVar3 + lVar20);
          __once = *(once_flag **)(lVar3 + 0x18 + lVar20);
          if ((~bVar1 & 0x60) == 0) {
            if (__once != (once_flag *)0x0) {
              local_70._0_8_ = FieldDescriptor::TypeOnceInit;
              local_80 = field;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (__once,(_func_void_FieldDescriptor_ptr **)local_70,&local_80);
            }
            iVar16 = *(int *)(FieldDescriptor::kTypeToCppTypeMap +
                             (ulong)*(byte *)(lVar3 + 2 + lVar20) * 4);
            uVar11 = 0x10;
            if (7 < iVar16 - 1U) {
              if (iVar16 == 9) {
                uVar11 = 0x18;
              }
              else {
                if (iVar16 != 10) goto LAB_00391ae4;
                bVar5 = anon_unknown_0::IsMapFieldInApi(field);
                uVar11 = 0x18;
                if (bVar5) {
                  uVar11 = 0x80;
                }
              }
            }
          }
          else {
            if (__once != (once_flag *)0x0) {
              local_70._0_8_ = FieldDescriptor::TypeOnceInit;
              local_80 = field;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (__once,(_func_void_FieldDescriptor_ptr **)local_70,&local_80);
            }
            if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                        (ulong)*(byte *)(lVar3 + 2 + lVar20) * 4) - 1U < 10) {
              uVar11 = *(uint *)(&DAT_00443870 +
                                (ulong)(*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                                (ulong)*(byte *)(lVar3 + 2 + lVar20) * 4) - 1U) * 4)
              ;
            }
            else {
LAB_00391ae4:
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_70,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/dynamic_message.cc"
                         ,0xcd);
              other = internal::LogMessage::operator<<((LogMessage *)local_70,"Can\'t get here.");
              internal::LogFinisher::operator=((LogFinisher *)&local_80,other);
              internal::LogMessage::~LogMessage((LogMessage *)local_70);
              uVar11 = 0;
            }
          }
          uVar19 = 8;
          if (uVar11 < 8) {
            uVar19 = uVar11;
          }
          iVar16 = uVar25 + uVar19 + -1;
          uVar25 = iVar16 - iVar16 % (int)uVar19;
          puVar9[lVar13] = uVar25;
          uVar25 = uVar25 + uVar11;
        }
        lVar13 = lVar13 + 1;
        lVar20 = lVar20 + 0x48;
      } while (lVar13 < *(int *)(local_90 + 4));
    }
    if (0 < *(int *)(local_90 + 0x68)) {
      plVar15 = (long *)(*(long *)(local_90 + 0x30) + 0x20);
      lVar20 = 0;
      do {
        if ((*(int *)((long)plVar15 + -0x1c) != 1) || ((*(byte *)(*plVar15 + 1) & 2) == 0)) {
          uVar11 = uVar25 + 0xe;
          if (-1 < (int)(uVar25 + 7)) {
            uVar11 = uVar25 + 7;
          }
          puVar9[*(int *)(local_90 + 4) + lVar20] = uVar11 & 0xfffffff8;
          uVar25 = (uVar11 & 0xfffffff8) + 8;
        }
        lVar20 = lVar20 + 1;
        plVar15 = plVar15 + 5;
      } while (lVar20 < *(int *)(local_90 + 0x68));
    }
    local_88->weak_field_map_offset = -1;
    local_88->size = uVar25;
    if (0 < *(int *)(local_90 + 0x68)) {
      lVar20 = *(long *)(local_90 + 0x30);
      lVar13 = 0;
      do {
        if (((*(int *)(lVar20 + 4 + lVar13 * 0x28) != 1) ||
            ((*(byte *)(*(long *)(lVar20 + lVar13 * 0x28 + 0x20) + 1) & 2) == 0)) &&
           (0 < *(int *)(*(long *)(local_90 + 0x30) + 4 + lVar13 * 0x28))) {
          lVar3 = *(long *)(local_90 + 0x30) + lVar13 * 0x28;
          lVar23 = *(long *)(lVar3 + 0x20);
          plVar15 = (long *)(lVar23 + 0x28);
          lVar24 = 0;
          do {
            if ((*plVar15 & 0x800) == 0) {
              plVar17 = plVar15 + -1;
              uVar14 = 0x28;
            }
            else {
              plVar17 = plVar15 + -3;
              if (*plVar15 != 0) {
                plVar17 = plVar15;
              }
              uVar14 = (ulong)(*plVar15 == 0) << 5 | 0x50;
            }
            puVar9[(int)((ulong)(lVar23 - *(long *)(*plVar17 + uVar14)) >> 3) * 0x38e38e39] =
                 0x40000000;
            lVar24 = lVar24 + 1;
            lVar23 = lVar23 + 0x48;
            plVar15 = plVar15 + 9;
          } while (lVar24 < *(int *)(lVar3 + 4));
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < *(int *)(local_90 + 0x68));
    }
    this_00 = (DynamicMessage *)operator_new((long)(int)uVar25);
    memset(this_00,0,(long)(int)uVar25);
    pTVar21 = local_88;
    DynamicMessage::DynamicMessage(this_00,local_88,false);
    local_70._0_8_ = pTVar21->prototype;
    local_70._8_8_ =
         (pTVar21->offsets)._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    local_70._16_8_ =
         (pTVar21->has_bits_indices)._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    local_70._24_4_ = pTVar21->has_bits_offset;
    local_70._28_4_ = 8;
    local_70._32_4_ = pTVar21->extensions_offset;
    local_70._36_4_ = pTVar21->oneof_case_offset;
    local_70._40_4_ = pTVar21->size;
    local_70._44_4_ = pTVar21->weak_field_map_offset;
    local_70._48_8_ = 0;
    local_38 = 0;
    this_01 = (Reflection *)operator_new(0x60);
    Reflection::Reflection
              (this_01,pTVar21->type,(ReflectionSchema *)local_70,pTVar21->pool,
               &local_78->super_MessageFactory);
    pRVar4 = (pTVar21->reflection)._M_t.
             super___uniq_ptr_impl<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_google::protobuf::Reflection_*,_std::default_delete<const_google::protobuf::Reflection>_>
             .super__Head_base<0UL,_const_google::protobuf::Reflection_*,_false>._M_head_impl;
    (pTVar21->reflection)._M_t.
    super___uniq_ptr_impl<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::Reflection_*,_std::default_delete<const_google::protobuf::Reflection>_>
    .super__Head_base<0UL,_const_google::protobuf::Reflection_*,_false>._M_head_impl = this_01;
    if (pRVar4 != (Reflection *)0x0) {
      operator_delete(pRVar4);
    }
    DynamicMessage::CrossLinkPrototypes(this_00);
  }
  else {
    this_00 = (*ppTVar7)->prototype;
  }
  return &this_00->super_Message;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototypeNoLock(
    const Descriptor* type) {
  if (delegate_to_generated_factory_ &&
      type->file()->pool() == DescriptorPool::generated_pool()) {
    return MessageFactory::generated_factory()->GetPrototype(type);
  }

  const TypeInfo** target = &prototypes_[type];
  if (*target != nullptr) {
    // Already exists.
    return (*target)->prototype;
  }

  TypeInfo* type_info = new TypeInfo;
  *target = type_info;

  type_info->type = type;
  type_info->pool = (pool_ == nullptr) ? type->file()->pool() : pool_;
  type_info->factory = this;

  // We need to construct all the structures passed to Reflection's constructor.
  // This includes:
  // - A block of memory that contains space for all the message's fields.
  // - An array of integers indicating the byte offset of each field within
  //   this block.
  // - A big bitfield containing a bit for each field indicating whether
  //   or not that field is set.
  int real_oneof_count = 0;
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    if (!type->oneof_decl(i)->is_synthetic()) {
      real_oneof_count++;
    }
  }

  // Compute size and offsets.
  uint32_t* offsets = new uint32_t[type->field_count() + real_oneof_count];
  type_info->offsets.reset(offsets);

  // Decide all field offsets by packing in order.
  // We place the DynamicMessage object itself at the beginning of the allocated
  // space.
  int size = sizeof(DynamicMessage);
  size = AlignOffset(size);

  // Next the has_bits, which is an array of uint32s.
  type_info->has_bits_offset = -1;
  int max_hasbit = 0;
  for (int i = 0; i < type->field_count(); i++) {
    if (HasHasbit(type->field(i))) {
      if (type_info->has_bits_offset == -1) {
        // At least one field in the message requires a hasbit, so allocate
        // hasbits.
        type_info->has_bits_offset = size;
        uint32_t* has_bits_indices = new uint32_t[type->field_count()];
        for (int j = 0; j < type->field_count(); j++) {
          // Initialize to -1, fields that need a hasbit will overwrite.
          has_bits_indices[j] = static_cast<uint32_t>(-1);
        }
        type_info->has_bits_indices.reset(has_bits_indices);
      }
      type_info->has_bits_indices[i] = max_hasbit++;
    }
  }

  if (max_hasbit > 0) {
    int has_bits_array_size = DivideRoundingUp(max_hasbit, bitsizeof(uint32_t));
    size += has_bits_array_size * sizeof(uint32_t);
    size = AlignOffset(size);
  }

  // The oneof_case, if any. It is an array of uint32s.
  if (real_oneof_count > 0) {
    type_info->oneof_case_offset = size;
    size += real_oneof_count * sizeof(uint32_t);
    size = AlignOffset(size);
  }

  // The ExtensionSet, if any.
  if (type->extension_range_count() > 0) {
    type_info->extensions_offset = size;
    size += sizeof(ExtensionSet);
    size = AlignOffset(size);
  } else {
    // No extensions.
    type_info->extensions_offset = -1;
  }

  // All the fields.
  //
  // TODO(b/31226269):  Optimize the order of fields to minimize padding.
  for (int i = 0; i < type->field_count(); i++) {
    // Make sure field is aligned to avoid bus errors.
    // Oneof fields do not use any space.
    if (!InRealOneof(type->field(i))) {
      int field_size = FieldSpaceUsed(type->field(i));
      size = AlignTo(size, std::min(kSafeAlignment, field_size));
      offsets[i] = size;
      size += field_size;
    }
  }

  // The oneofs.
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    if (!type->oneof_decl(i)->is_synthetic()) {
      size = AlignTo(size, kSafeAlignment);
      offsets[type->field_count() + i] = size;
      size += kMaxOneofUnionSize;
    }
  }

  type_info->weak_field_map_offset = -1;

  // Align the final size to make sure no clever allocators think that
  // alignment is not necessary.
  type_info->size = size;

  // Construct the reflection object.

  // Compute the size of default oneof instance and offsets of default
  // oneof fields.
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    if (type->oneof_decl(i)->is_synthetic()) continue;
    for (int j = 0; j < type->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = type->oneof_decl(i)->field(j);
      // oneof fields are not accessed through offsets, but we still have the
      // entry from a legacy implementation. This should be removed at some
      // point.
      // Mark the field to prevent unintentional access through reflection.
      // Don't use the top bit because that is for unused fields.
      offsets[field->index()] = internal::kInvalidFieldOffsetTag;
    }
  }

  // Allocate the prototype fields.
  void* base = operator new(size);
  memset(base, 0, size);

  // We have already locked the factory so we should not lock in the constructor
  // of dynamic message to avoid dead lock.
  DynamicMessage* prototype = new (base) DynamicMessage(type_info, false);

  internal::ReflectionSchema schema = {
      type_info->prototype,
      type_info->offsets.get(),
      type_info->has_bits_indices.get(),
      type_info->has_bits_offset,
      PROTOBUF_FIELD_OFFSET(DynamicMessage, _internal_metadata_),
      type_info->extensions_offset,
      type_info->oneof_case_offset,
      type_info->size,
      type_info->weak_field_map_offset,
      nullptr /* inlined_string_indices_ */,
      0 /* inlined_string_donated_offset_ */};

  type_info->reflection.reset(
      new Reflection(type_info->type, schema, type_info->pool, this));

  // Cross link prototypes.
  prototype->CrossLinkPrototypes();

  return prototype;
}